

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

void packint(luaL_Buffer *b,lua_Unsigned n,int islittle,int size,int neg)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  char *pcVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  pcVar6 = luaL_prepbuffsize(b,(long)size);
  iVar7 = 0;
  if (islittle == 0) {
    iVar7 = size + -1;
  }
  pcVar6[iVar7] = (char)n;
  if (1 < size) {
    iVar7 = size + -2;
    iVar8 = 1;
    do {
      iVar9 = iVar8;
      if (islittle == 0) {
        iVar9 = iVar7;
      }
      pcVar6[iVar9] = (char)(n >> 8);
      iVar8 = iVar8 + 1;
      bVar10 = iVar7 != 0;
      iVar7 = iVar7 + -1;
      n = n >> 8;
    } while (bVar10);
    if (8 < size && neg != 0) {
      uVar14 = size - 9;
      iVar8 = size + -0x18;
      iVar7 = 0x17;
      uVar11 = uVar14 ^ 0x80000000;
      uVar12 = uVar14 ^ 0x80000000;
      uVar13 = uVar14 ^ 0x80000000;
      uVar14 = uVar14 ^ 0x80000000;
      do {
        uVar1 = iVar7 - 0x17;
        if ((bool)(~((int)uVar11 < (int)(uVar1 ^ 0x80000000)) & 1)) {
          iVar9 = iVar8 + 0xf;
          if (islittle != 0) {
            iVar9 = iVar7 + -0xf;
          }
          pcVar6[iVar9] = -1;
        }
        bVar10 = (int)uVar12 < (int)((uVar1 | 1) ^ 0x80000000);
        auVar5._4_4_ = -(uint)((int)uVar13 < (int)((uVar1 | 2) ^ 0x80000000));
        auVar5._0_4_ = -(uint)bVar10;
        auVar5._8_4_ = -(uint)((int)uVar14 < (int)((uVar1 | 3) ^ 0x80000000));
        auVar5._12_4_ = 0;
        auVar16._8_4_ = 0xffffffff;
        auVar16._0_8_ = 0xffffffffffffffff;
        auVar16._12_4_ = 0xffffffff;
        if (!bVar10) {
          iVar9 = iVar8 + 0xe;
          if (islittle != 0) {
            iVar9 = iVar7 + -0xe;
          }
          pcVar6[iVar9] = -1;
        }
        auVar16 = (auVar5 << 0x20 ^ auVar16) >> 0x30;
        auVar16 = packsswb(auVar16,auVar16);
        if ((auVar16._0_4_ >> 0x18 & 1) != 0) {
          iVar9 = iVar8 + 0xc;
          if (islittle != 0) {
            iVar9 = iVar7 + -0xc;
          }
          pcVar6[iVar9] = -1;
        }
        auVar17._0_4_ = -(uint)((int)uVar11 < (int)((uVar1 | 4) ^ 0x80000000));
        auVar17._4_4_ = -(uint)((int)uVar12 < (int)((uVar1 | 5) ^ 0x80000000));
        auVar17._8_4_ = -(uint)((int)uVar13 < (int)((uVar1 | 6) ^ 0x80000000));
        auVar17._12_4_ = -(uint)((int)uVar14 < (int)((uVar1 | 7) ^ 0x80000000));
        if ((((ushort)auVar17._0_4_ ^ 0xffff) & 1) != 0) {
          iVar9 = iVar8 + 0xb;
          if (islittle != 0) {
            iVar9 = iVar7 + -0xb;
          }
          pcVar6[iVar9] = -1;
        }
        auVar2._8_4_ = 0xffffffff;
        auVar2._0_8_ = 0xffffffffffffffff;
        auVar2._12_4_ = 0xffffffff;
        auVar17 = auVar17 ^ auVar2;
        auVar20._0_8_ = auVar17._0_8_ << 0x30;
        auVar20._8_8_ = auVar17._8_8_ << 0x30 | auVar17._0_8_ >> 0x10;
        auVar16 = packsswb(auVar20,auVar20);
        if ((auVar16._4_2_ >> 8 & 1) != 0) {
          iVar9 = iVar8 + 10;
          if (islittle != 0) {
            iVar9 = iVar7 + -10;
          }
          pcVar6[iVar9] = -1;
        }
        if ((auVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          iVar9 = iVar8 + 9;
          if (islittle != 0) {
            iVar9 = iVar7 + -9;
          }
          pcVar6[iVar9] = -1;
        }
        if ((auVar17._11_2_ >> 8 & 1) != 0) {
          iVar9 = iVar8 + 8;
          if (islittle != 0) {
            iVar9 = iVar7 + -8;
          }
          pcVar6[iVar9] = -1;
        }
        auVar18._0_4_ = -(uint)((int)uVar11 < (int)((uVar1 | 8) ^ 0x80000000));
        auVar18._4_4_ = -(uint)((int)uVar12 < (int)((uVar1 | 9) ^ 0x80000000));
        auVar18._8_4_ = -(uint)((int)uVar13 < (int)((uVar1 | 10) ^ 0x80000000));
        auVar18._12_4_ = -(uint)((int)uVar14 < (int)((uVar1 | 0xb) ^ 0x80000000));
        if ((((ushort)auVar18._0_4_ ^ 0xffff) & 1) != 0) {
          iVar9 = iVar8 + 7;
          if (islittle != 0) {
            iVar9 = iVar7 + -7;
          }
          pcVar6[iVar9] = -1;
        }
        auVar3._8_4_ = 0xffffffff;
        auVar3._0_8_ = 0xffffffffffffffff;
        auVar3._12_4_ = 0xffffffff;
        if ((SUB162(auVar18 ^ auVar3,3) >> 8 & 1) != 0) {
          iVar9 = iVar8 + 6;
          if (islittle != 0) {
            iVar9 = iVar7 + -6;
          }
          pcVar6[iVar9] = -1;
        }
        auVar16 = pshufhw(auVar18,auVar18,0);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        if (((auVar16 ^ auVar4) & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          iVar9 = iVar8 + 5;
          if (islittle != 0) {
            iVar9 = iVar7 + -5;
          }
          pcVar6[iVar9] = -1;
        }
        auVar16 = packsswb(auVar16 ^ auVar4,(auVar18 ^ auVar3) >> 0x30);
        if ((auVar16._10_2_ >> 8 & 1) != 0) {
          iVar9 = iVar8 + 4;
          if (islittle != 0) {
            iVar9 = iVar7 + -4;
          }
          pcVar6[iVar9] = -1;
        }
        auVar15._0_4_ = -(uint)((int)uVar11 < (int)((uVar1 | 0xc) ^ 0x80000000));
        auVar15._4_4_ = -(uint)((int)uVar12 < (int)((uVar1 | 0xd) ^ 0x80000000));
        auVar15._8_4_ = -(uint)((int)uVar13 < (int)((uVar1 | 0xe) ^ 0x80000000));
        auVar15._12_4_ = -(uint)((int)uVar14 < (int)((uVar1 | 0xf) ^ 0x80000000));
        if ((((ushort)auVar15._0_4_ ^ 0xffff) & 1) != 0) {
          iVar9 = iVar8 + 3;
          if (islittle != 0) {
            iVar9 = iVar7 + -3;
          }
          pcVar6[iVar9] = -1;
        }
        auVar19._8_4_ = 0xffffffff;
        auVar19._0_8_ = 0xffffffffffffffff;
        auVar19._12_4_ = 0xffffffff;
        auVar19 = auVar15 ^ auVar19;
        auVar21._0_8_ = auVar19._0_8_ << 0x30;
        auVar21._8_8_ = auVar19._8_8_ << 0x30 | auVar19._0_8_ >> 0x10;
        auVar16 = packsswb(auVar21,auVar21);
        if ((auVar16._12_2_ >> 8 & 1) != 0) {
          iVar9 = iVar8 + 2;
          if (islittle != 0) {
            iVar9 = iVar7 + -2;
          }
          pcVar6[iVar9] = -1;
        }
        auVar16 = pshufhw(auVar15,auVar15,0);
        if (((auVar16._14_2_ ^ 0xffff) & 1) != 0) {
          iVar9 = iVar8 + 1;
          if (islittle != 0) {
            iVar9 = iVar7 + -1;
          }
          pcVar6[iVar9] = -1;
        }
        if ((auVar19._14_2_ >> 8 & 1) != 0) {
          iVar9 = iVar7;
          if (islittle == 0) {
            iVar9 = iVar8;
          }
          pcVar6[iVar9] = -1;
        }
        iVar8 = iVar8 + -0x10;
        iVar9 = iVar7 - (size + 7U & 0xfffffff0);
        iVar7 = iVar7 + 0x10;
      } while (iVar9 != 7);
    }
  }
  b->n = b->n + (long)size;
  return;
}

Assistant:

static void packint (luaL_Buffer *b, lua_Unsigned n,
                     int islittle, int size, int neg) {
  char *buff = luaL_prepbuffsize(b, size);
  int i;
  buff[islittle ? 0 : size - 1] = (char)(n & MC);  /* first byte */
  for (i = 1; i < size; i++) {
    n >>= NB;
    buff[islittle ? i : size - 1 - i] = (char)(n & MC);
  }
  if (neg && size > SZINT) {  /* negative number need sign extension? */
    for (i = SZINT; i < size; i++)  /* correct extra bytes */
      buff[islittle ? i : size - 1 - i] = (char)MC;
  }
  luaL_addsize(b, size);  /* add result to buffer */
}